

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall HighsDomain::conflictAnalysis(HighsDomain *this,HighsConflictPool *conflictPool)

{
  HighsDomain *this_00;
  HighsMipSolverData *pHVar1;
  ConflictSet conflictSet;
  ConflictSet local_d0;
  
  pHVar1 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar1->domain;
  if (((this_00 != this) && ((pHVar1->domain).infeasible_ == false)) && (this->infeasible_ == true))
  {
    propagate(this_00);
    if ((((this->mipsolver->mipdata_)._M_t.
          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
          super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain).infeasible_ ==
        false) {
      ConflictSet::ConflictSet(&local_d0,this);
      ConflictSet::conflictAnalysis(&local_d0,conflictPool);
      if (local_d0.resolveBuffer.
          super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.resolveBuffer.
                        super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d0.resolvedDomainChanges.
          super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.resolvedDomainChanges.
                        super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d0.resolveQueue.
          super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.resolveQueue.
                        super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ::~_Rb_tree(&local_d0.reconvergenceFrontier._M_t);
      std::
      _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ::~_Rb_tree(&local_d0.reasonSideFrontier._M_t);
    }
  }
  return;
}

Assistant:

void HighsDomain::conflictAnalysis(HighsConflictPool& conflictPool) {
  if (&mipsolver->mipdata_->domain == this) return;
  if (mipsolver->mipdata_->domain.infeasible() || !infeasible_) return;

  mipsolver->mipdata_->domain.propagate();
  if (mipsolver->mipdata_->domain.infeasible()) return;

  ConflictSet conflictSet(*this);

  conflictSet.conflictAnalysis(conflictPool);
}